

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MXF.cpp
# Opt level: O1

Partition * __thiscall ASDCP::MXF::Partition::InitFromBuffer(Partition *this,byte_t *p,ui32_t l)

{
  uint uVar1;
  ulong uVar2;
  undefined8 uVar3;
  bool bVar4;
  ILogSink *this_00;
  ui32_t in_ECX;
  ulong uVar5;
  ui32_t uVar6;
  undefined4 in_register_00000014;
  MemIOReader MemRDR;
  MemIOReader local_30;
  undefined4 local_1c;
  
  Kumu::MemIOReader::MemIOReader(&local_30,(byte_t *)CONCAT44(in_register_00000014,l),in_ECX);
  local_1c = 0x146;
  Kumu::Result_t::operator()((int *)this,ASDCP::RESULT_KLV_CODING);
  uVar5 = (ulong)local_30.m_capacity;
  uVar6 = local_30.m_size;
  if ((ulong)local_30.m_size + 2 <= uVar5) {
    *(ushort *)(p + 0x80) =
         *(ushort *)(local_30.m_p + local_30.m_size) << 8 |
         *(ushort *)(local_30.m_p + local_30.m_size) >> 8;
    uVar6 = local_30.m_size + 2;
    if ((ulong)uVar6 + 2 <= uVar5) {
      *(ushort *)(p + 0x82) =
           *(ushort *)(local_30.m_p + uVar6) << 8 | *(ushort *)(local_30.m_p + uVar6) >> 8;
      uVar6 = local_30.m_size + 4;
      if ((ulong)uVar6 + 4 <= uVar5) {
        uVar1 = *(uint *)(local_30.m_p + uVar6);
        *(uint *)(p + 0x84) =
             uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
        uVar6 = local_30.m_size + 8;
        if ((ulong)uVar6 + 8 <= uVar5) {
          uVar2 = *(ulong *)(local_30.m_p + uVar6);
          *(ulong *)(p + 0x88) =
               uVar2 >> 0x38 | (uVar2 & 0xff000000000000) >> 0x28 | (uVar2 & 0xff0000000000) >> 0x18
               | (uVar2 & 0xff00000000) >> 8 | (uVar2 & 0xff000000) << 8 |
               (uVar2 & 0xff0000) << 0x18 | (uVar2 & 0xff00) << 0x28 | uVar2 << 0x38;
          uVar6 = local_30.m_size + 0x10;
          if ((ulong)uVar6 + 8 <= uVar5) {
            uVar2 = *(ulong *)(local_30.m_p + uVar6);
            *(ulong *)(p + 0x90) =
                 uVar2 >> 0x38 | (uVar2 & 0xff000000000000) >> 0x28 |
                 (uVar2 & 0xff0000000000) >> 0x18 | (uVar2 & 0xff00000000) >> 8 |
                 (uVar2 & 0xff000000) << 8 | (uVar2 & 0xff0000) << 0x18 | (uVar2 & 0xff00) << 0x28 |
                 uVar2 << 0x38;
            uVar6 = local_30.m_size + 0x18;
            if ((ulong)uVar6 + 8 <= uVar5) {
              uVar2 = *(ulong *)(local_30.m_p + uVar6);
              *(ulong *)(p + 0x98) =
                   uVar2 >> 0x38 | (uVar2 & 0xff000000000000) >> 0x28 |
                   (uVar2 & 0xff0000000000) >> 0x18 | (uVar2 & 0xff00000000) >> 8 |
                   (uVar2 & 0xff000000) << 8 | (uVar2 & 0xff0000) << 0x18 | (uVar2 & 0xff00) << 0x28
                   | uVar2 << 0x38;
              uVar6 = local_30.m_size + 0x20;
              if ((ulong)uVar6 + 8 <= uVar5) {
                uVar2 = *(ulong *)(local_30.m_p + uVar6);
                *(ulong *)(p + 0xa0) =
                     uVar2 >> 0x38 | (uVar2 & 0xff000000000000) >> 0x28 |
                     (uVar2 & 0xff0000000000) >> 0x18 | (uVar2 & 0xff00000000) >> 8 |
                     (uVar2 & 0xff000000) << 8 | (uVar2 & 0xff0000) << 0x18 |
                     (uVar2 & 0xff00) << 0x28 | uVar2 << 0x38;
                uVar6 = local_30.m_size + 0x28;
                if ((ulong)uVar6 + 8 <= uVar5) {
                  uVar2 = *(ulong *)(local_30.m_p + uVar6);
                  *(ulong *)(p + 0xa8) =
                       uVar2 >> 0x38 | (uVar2 & 0xff000000000000) >> 0x28 |
                       (uVar2 & 0xff0000000000) >> 0x18 | (uVar2 & 0xff00000000) >> 8 |
                       (uVar2 & 0xff000000) << 8 | (uVar2 & 0xff0000) << 0x18 |
                       (uVar2 & 0xff00) << 0x28 | uVar2 << 0x38;
                  uVar6 = local_30.m_size + 0x30;
                  if ((ulong)uVar6 + 4 <= uVar5) {
                    uVar1 = *(uint *)(local_30.m_p + uVar6);
                    *(uint *)(p + 0xb0) =
                         uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 |
                         uVar1 << 0x18;
                    uVar6 = local_30.m_size + 0x34;
                    if ((ulong)uVar6 + 8 <= uVar5) {
                      uVar2 = *(ulong *)(local_30.m_p + uVar6);
                      *(ulong *)(p + 0xb8) =
                           uVar2 >> 0x38 | (uVar2 & 0xff000000000000) >> 0x28 |
                           (uVar2 & 0xff0000000000) >> 0x18 | (uVar2 & 0xff00000000) >> 8 |
                           (uVar2 & 0xff000000) << 8 | (uVar2 & 0xff0000) << 0x18 |
                           (uVar2 & 0xff00) << 0x28 | uVar2 << 0x38;
                      uVar6 = local_30.m_size + 0x3c;
                      if ((ulong)uVar6 + 4 <= uVar5) {
                        uVar1 = *(uint *)(local_30.m_p + uVar6);
                        *(uint *)(p + 0xc0) =
                             uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 |
                             uVar1 << 0x18;
                        uVar6 = local_30.m_size + 0x40;
                        local_30.m_size = local_30.m_size + 0x50;
                        if (local_30.m_capacity < local_30.m_size) {
                          p[0xd0] = '\0';
                        }
                        else {
                          uVar3 = *(undefined8 *)(local_30.m_p + uVar6 + 8);
                          *(undefined8 *)(p + 0xd1) = *(undefined8 *)(local_30.m_p + uVar6);
                          *(undefined8 *)(p + 0xd9) = uVar3;
                          p[0xd0] = local_30.m_size <= local_30.m_capacity;
                          bVar4 = FixedSizeItemCollection<ASDCP::MXF::PushSet<ASDCP::UL>_>::
                                  Unarchive((FixedSizeItemCollection<ASDCP::MXF::PushSet<ASDCP::UL>_>
                                             *)(p + 0xe8),&local_30);
                          uVar6 = local_30.m_size;
                          if (bVar4) {
                            Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&Kumu::RESULT_OK)
                            ;
                            uVar6 = local_30.m_size;
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  local_30.m_size = uVar6;
  if (*(int *)&(this->super_KLVFilePacket).super_KLVPacket._vptr_KLVPacket < 0) {
    this_00 = (ILogSink *)Kumu::DefaultLogSink();
    Kumu::ILogSink::Error(this_00,"Failed to initialize Partition.\n");
  }
  return this;
}

Assistant:

ASDCP::Result_t
ASDCP::MXF::Partition::InitFromBuffer(const byte_t* p, ui32_t l)
{
  Kumu::MemIOReader MemRDR(p, l);
  Result_t result = RESULT_KLV_CODING(__LINE__, __FILE__);

  if ( MemRDR.ReadUi16BE(&MajorVersion) )
    if ( MemRDR.ReadUi16BE(&MinorVersion) )
      if ( MemRDR.ReadUi32BE(&KAGSize) )
	if ( MemRDR.ReadUi64BE(&ThisPartition) )
	  if ( MemRDR.ReadUi64BE(&PreviousPartition) )
	    if ( MemRDR.ReadUi64BE(&FooterPartition) )
	      if ( MemRDR.ReadUi64BE(&HeaderByteCount) )
		if ( MemRDR.ReadUi64BE(&IndexByteCount) )
		  if ( MemRDR.ReadUi32BE(&IndexSID) )
		    if ( MemRDR.ReadUi64BE(&BodyOffset) )
		      if ( MemRDR.ReadUi32BE(&BodySID) )
			if ( OperationalPattern.Unarchive(&MemRDR) )
			  if ( EssenceContainers.Unarchive(&MemRDR) )
			    result = RESULT_OK;

  if ( ASDCP_FAILURE(result) )
    DefaultLogSink().Error("Failed to initialize Partition.\n");

  return result;
}